

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

void __thiscall flatbuffers::Parser::ParseType(Parser *this,Type *type)

{
  int iVar1;
  undefined8 uVar2;
  const_iterator cVar3;
  long lVar4;
  StructDef *pSVar5;
  undefined8 extraout_RAX;
  string local_58;
  Type local_38;
  
  iVar1 = this->token_;
  if (iVar1 - 0xdU < 0xc) {
    type->base_type = iVar1 - BASE_TYPE_FLOAT;
LAB_0010c2ef:
    Next(this);
    return;
  }
  if (iVar1 == 0x5b) {
    Next(this);
    local_38.base_type = BASE_TYPE_NONE;
    local_38.element = BASE_TYPE_NONE;
    local_38.struct_def = (StructDef *)0x0;
    local_38.enum_def = (EnumDef *)0x0;
    ParseType(this,&local_38);
    if (local_38.base_type != BASE_TYPE_UNION) {
      if (local_38.base_type != BASE_TYPE_VECTOR) {
        type->base_type = BASE_TYPE_VECTOR;
        type->struct_def = local_38.struct_def;
        type->enum_def = (EnumDef *)0x0;
        type->element = local_38.base_type;
        Expect(this,0x5d);
        return;
      }
      goto LAB_0010c43d;
    }
  }
  else {
    if (iVar1 == 4) {
      cVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>_>
                      *)&this->enums_,&this->attribute_);
      if ((_Rb_tree_header *)cVar3._M_node ==
          &(this->enums_).dict._M_t._M_impl.super__Rb_tree_header) {
        lVar4 = 0;
      }
      else {
        lVar4 = *(long *)(cVar3._M_node + 2);
      }
      if (lVar4 == 0) {
        type->base_type = BASE_TYPE_STRUCT;
        pSVar5 = LookupCreateStruct(this,&this->attribute_);
        type->struct_def = pSVar5;
      }
      else {
        type->enum_def = *(EnumDef **)(lVar4 + 0xf0);
        uVar2 = *(undefined8 *)(lVar4 + 0xe0);
        pSVar5 = *(StructDef **)(lVar4 + 0xe8);
        type->base_type = (int)uVar2;
        type->element = (int)((ulong)uVar2 >> 0x20);
        type->struct_def = pSVar5;
        if (*(char *)(lVar4 + 0xd8) == '\x01') {
          type->base_type = BASE_TYPE_UNION;
        }
      }
      goto LAB_0010c2ef;
    }
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"illegal type syntax","");
    Error(&local_58);
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"vector of union types not supported (wrap in table first).","");
  Error(&local_58);
LAB_0010c43d:
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"nested vector types not supported (wrap in table first).","");
  Error(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void Parser::ParseType(Type &type) {
  if (token_ >= kTokenBOOL && token_ <= kTokenSTRING) {
    type.base_type = static_cast<BaseType>(token_ - kTokenNONE);
  } else {
    if (token_ == kTokenIdentifier) {
      auto enum_def = enums_.Lookup(attribute_);
      if (enum_def) {
        type = enum_def->underlying_type;
        if (enum_def->is_union) type.base_type = BASE_TYPE_UNION;
      } else {
        type.base_type = BASE_TYPE_STRUCT;
        type.struct_def = LookupCreateStruct(attribute_);
      }
    } else if (token_ == '[') {
      Next();
      Type subtype;
      ParseType(subtype);
      if (subtype.base_type == BASE_TYPE_VECTOR) {
        // We could support this, but it will complicate things, and it's
        // easier to work around with a struct around the inner vector.
        Error("nested vector types not supported (wrap in table first).");
      }
      if (subtype.base_type == BASE_TYPE_UNION) {
        // We could support this if we stored a struct of 2 elements per
        // union element.
        Error("vector of union types not supported (wrap in table first).");
      }
      type = Type(BASE_TYPE_VECTOR, subtype.struct_def);
      type.element = subtype.base_type;
      Expect(']');
      return;
    } else {
      Error("illegal type syntax");
    }
  }
  Next();
}